

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O1

Mat * __thiscall
ncnn::ModelBinFromMatArray::load
          (Mat *__return_storage_ptr__,ModelBinFromMatArray *this,int param_1,int param_2)

{
  Mat *pMVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Mat *m;
  
  pMVar1 = this->d->weights;
  if (pMVar1 != (Mat *)0x0) {
    __return_storage_ptr__->data = pMVar1->data;
    piVar2 = pMVar1->refcount;
    __return_storage_ptr__->refcount = piVar2;
    __return_storage_ptr__->elemsize = pMVar1->elemsize;
    __return_storage_ptr__->elempack = pMVar1->elempack;
    __return_storage_ptr__->allocator = pMVar1->allocator;
    iVar3 = pMVar1->w;
    iVar4 = pMVar1->h;
    iVar5 = pMVar1->d;
    __return_storage_ptr__->dims = pMVar1->dims;
    __return_storage_ptr__->w = iVar3;
    __return_storage_ptr__->h = iVar4;
    __return_storage_ptr__->d = iVar5;
    __return_storage_ptr__->c = pMVar1->c;
    __return_storage_ptr__->cstep = pMVar1->cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    this->d->weights = this->d->weights + 1;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->cstep = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->d = 0;
  __return_storage_ptr__->c = 0;
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromMatArray::load(int /*w*/, int /*type*/) const
{
    if (!d->weights)
        return Mat();

    Mat m = d->weights[0];
    d->weights++;
    return m;
}